

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

char * lookup_name(name_cache_conflict *cache,_func_char_ptr_name_cache_ptr_id_t *lookup_fn,id_t id)

{
  int iVar1;
  long lVar2;
  uint in_EDX;
  code *in_RSI;
  long in_RDI;
  int slot;
  char *name;
  char *local_8;
  
  *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  iVar1 = (int)((ulong)in_EDX % *(ulong *)(in_RDI + 0x20));
  if (*(long *)(in_RDI + (long)iVar1 * 0x10 + 0x30) != 0) {
    if (*(uint *)(in_RDI + 0x28 + (long)iVar1 * 0x10) == in_EDX) {
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
      if (*(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30) == "(noname)") {
        return (char *)0x0;
      }
      return *(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30);
    }
    if (*(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30) != "(noname)") {
      free(*(void **)(in_RDI + (long)iVar1 * 0x10 + 0x30));
    }
    *(undefined8 *)(in_RDI + (long)iVar1 * 0x10 + 0x30) = 0;
  }
  lVar2 = (*in_RSI)(in_RDI,in_EDX);
  if (lVar2 == 0) {
    *(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30) = "(noname)";
    *(uint *)(in_RDI + 0x28 + (long)iVar1 * 0x10) = in_EDX;
    local_8 = (char *)0x0;
  }
  else {
    *(long *)(in_RDI + (long)iVar1 * 0x10 + 0x30) = lVar2;
    *(uint *)(in_RDI + 0x28 + (long)iVar1 * 0x10) = in_EDX;
    local_8 = *(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30);
  }
  return local_8;
}

Assistant:

static const char *
lookup_name(struct cpio *cpio, struct name_cache **name_cache_variable,
    int (*lookup_fn)(struct cpio *, const char **, id_t), id_t id)
{
	char asnum[16];
	struct name_cache	*cache;
	const char *name;
	int slot;


	if (*name_cache_variable == NULL) {
		*name_cache_variable = malloc(sizeof(struct name_cache));
		if (*name_cache_variable == NULL)
			lafe_errc(1, ENOMEM, "No more memory");
		memset(*name_cache_variable, 0, sizeof(struct name_cache));
		(*name_cache_variable)->size = name_cache_size;
	}

	cache = *name_cache_variable;
	cache->probes++;

	slot = id % cache->size;
	if (cache->cache[slot].name != NULL) {
		if (cache->cache[slot].id == id) {
			cache->hits++;
			return (cache->cache[slot].name);
		}
		free(cache->cache[slot].name);
		cache->cache[slot].name = NULL;
	}

	if (lookup_fn(cpio, &name, id) == 0) {
		if (name == NULL || name[0] == '\0') {
			/* If lookup failed, format it as a number. */
			snprintf(asnum, sizeof(asnum), "%u", (unsigned)id);
			name = asnum;
		}
		cache->cache[slot].name = strdup(name);
		if (cache->cache[slot].name != NULL) {
			cache->cache[slot].id = id;
			return (cache->cache[slot].name);
		}
		/*
		 * Conveniently, NULL marks an empty slot, so
		 * if the strdup() fails, we've just failed to
		 * cache it.  No recovery necessary.
		 */
	}
	return (NULL);
}